

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  _func_int **pp_Var1;
  cmMakefile *this_00;
  pointer pcVar2;
  Snapshot snapshot;
  Snapshot snapshot_00;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  cmLocalGenerator *pcVar6;
  size_t sVar7;
  cmGlobalGenerator *this_01;
  cmLocalGenerator *pcVar8;
  char *__s;
  uint uVar9;
  string *name;
  pointer pbVar10;
  bool bVar11;
  bool bVar12;
  int result_1;
  string dep_newest;
  string out_oldest;
  int result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  products;
  ostringstream msg_2;
  cmake cm;
  cmGlobalGenerator gg;
  int local_abc;
  long *local_ab8;
  long local_ab0;
  long local_aa8 [2];
  long *local_a98;
  long local_a90;
  long local_a88 [2];
  int local_a78;
  undefined4 uStack_a74;
  long local_a68 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a18;
  undefined1 local_a00 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9f0 [6];
  ios_base local_990 [264];
  Snapshot local_888;
  Snapshot local_870;
  cmake local_858;
  undefined1 local_5f8 [112];
  ios_base local_588 [1368];
  
  pcVar4 = cmsys::SystemTools::GetEnv("VERBOSE");
  if (pcVar4 == (char *)0x0) {
    if ((this->CheckBuildSystemArgument)._M_string_length == 0) {
      return 1;
    }
    bVar11 = cmsys::SystemTools::FileExists((this->CheckBuildSystemArgument)._M_dataplus._M_p);
    if (!bVar11) {
      return 1;
    }
    bVar11 = false;
  }
  else {
    pcVar4 = cmsys::SystemTools::GetEnv("CMAKE_NO_VERBOSE");
    bVar11 = pcVar4 == (char *)0x0;
    if ((this->CheckBuildSystemArgument)._M_string_length == 0) {
      if (pcVar4 != (char *)0x0) {
        return 1;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5f8,"Re-run cmake no build system arguments\n",0x27);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout
                ((char *)local_858.Generators.
                         super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
LAB_00384faf:
      if (local_858.Generators.
          super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_858.Generators.
                    super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_858.Generators.
                        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_858.Generators.
                              super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
      std::ios_base::~ios_base(local_588);
      return 1;
    }
    bVar3 = cmsys::SystemTools::FileExists((this->CheckBuildSystemArgument)._M_dataplus._M_p);
    if (!bVar3) {
      if (pcVar4 != (char *)0x0) {
        return 1;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5f8,"Re-run cmake missing file: ",0x1b);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_5f8,(this->CheckBuildSystemArgument)._M_dataplus._M_p,
                          (this->CheckBuildSystemArgument)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout
                ((char *)local_858.Generators.
                         super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_00384faf;
    }
  }
  cmake(&local_858);
  pp_Var1 = (_func_int **)(local_5f8 + 0x10);
  local_5f8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"");
  cmState::SetSourceDirectory(local_858.State,(string *)local_5f8);
  if ((_func_int **)local_5f8._0_8_ != pp_Var1) {
    operator_delete((void *)local_5f8._0_8_,local_5f8._16_8_ + 1);
  }
  local_5f8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"");
  cmState::SetBinaryDirectory(local_858.State,(string *)local_5f8);
  if ((_func_int **)local_5f8._0_8_ != pp_Var1) {
    operator_delete((void *)local_5f8._0_8_,local_5f8._16_8_ + 1);
  }
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)local_5f8,&local_858);
  cmState::Snapshot::Snapshot(&local_870,(cmState *)0x0,(PositionType)ZEXT816(0));
  snapshot.Position.Tree = local_870.Position.Tree;
  snapshot.State = local_870.State;
  snapshot.Position.Position = local_870.Position.Position;
  pcVar6 = cmGlobalGenerator::MakeLocalGenerator
                     ((cmGlobalGenerator *)local_5f8,snapshot,(cmLocalGenerator *)0x0);
  this_00 = pcVar6->Makefile;
  bVar3 = cmMakefile::ReadListFile(this_00,(this->CheckBuildSystemArgument)._M_dataplus._M_p);
  if ((((!bVar3) || (cmSystemTools::s_ErrorOccured != false)) ||
      (cmSystemTools::s_FatalErrorOccured != false)) ||
     (bVar3 = cmSystemTools::GetInterruptFlag(), bVar3)) {
    uVar9 = 1;
    if (bVar11 != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a00,"Re-run cmake error reading : ",0x1d);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_a00,(this->CheckBuildSystemArgument)._M_dataplus._M_p,
                          (this->CheckBuildSystemArgument)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout((char *)local_ab8);
      if (local_ab8 != local_aa8) {
        operator_delete(local_ab8,local_aa8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a00);
      std::ios_base::~ios_base(local_990);
    }
  }
  else {
    if (this->ClearBuildSystem == true) {
      local_a00._0_8_ = local_a00 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a00,"CMAKE_DEPENDS_GENERATOR","");
      pcVar4 = cmMakefile::GetDefinition(this_00,(string *)local_a00);
      if ((undefined1 *)local_a00._0_8_ != local_a00 + 0x10) {
        operator_delete((void *)local_a00._0_8_,local_9f0[0]._M_allocated_capacity + 1);
      }
      if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
        pcVar4 = "Unix Makefiles";
      }
      local_a00._0_8_ = local_a00 + 0x10;
      sVar7 = strlen(pcVar4);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a00,pcVar4,pcVar4 + sVar7);
      this_01 = CreateGlobalGenerator(this,(string *)local_a00);
      if ((undefined1 *)local_a00._0_8_ != local_a00 + 0x10) {
        operator_delete((void *)local_a00._0_8_,local_9f0[0]._M_allocated_capacity + 1);
      }
      if (this_01 != (cmGlobalGenerator *)0x0) {
        cmState::Snapshot::Snapshot(&local_888,(cmState *)0x0,(PositionType)ZEXT816(0));
        snapshot_00.Position.Tree = local_888.Position.Tree;
        snapshot_00.State = local_888.State;
        snapshot_00.Position.Position = local_888.Position.Position;
        pcVar8 = cmGlobalGenerator::MakeLocalGenerator(this_01,snapshot_00,(cmLocalGenerator *)0x0);
        (*pcVar8->_vptr_cmLocalGenerator[9])(pcVar8,this_00,(ulong)bVar11);
        (*pcVar8->_vptr_cmLocalGenerator[1])(pcVar8);
        (*this_01->_vptr_cmGlobalGenerator[1])(this_01);
      }
    }
    local_a00._0_8_ = local_a00 + 0x10;
    local_a18.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_a18.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_a18.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a00,"CMAKE_MAKEFILE_PRODUCTS","");
    pcVar4 = cmMakefile::GetDefinition(this_00,(string *)local_a00);
    if ((undefined1 *)local_a00._0_8_ != local_a00 + 0x10) {
      operator_delete((void *)local_a00._0_8_,local_9f0[0]._M_allocated_capacity + 1);
    }
    name = local_a18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if (pcVar4 != (char *)0x0) {
      local_a00._0_8_ = local_a00 + 0x10;
      sVar7 = strlen(pcVar4);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a00,pcVar4,pcVar4 + sVar7);
      cmSystemTools::ExpandListArgument((string *)local_a00,&local_a18,false);
      name = local_a18.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      if ((undefined1 *)local_a00._0_8_ != local_a00 + 0x10) {
        operator_delete((void *)local_a00._0_8_,local_9f0[0]._M_allocated_capacity + 1);
        name = local_a18.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    for (; name != local_a18.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; name = name + 1) {
      bVar3 = cmsys::SystemTools::FileExists((name->_M_dataplus)._M_p);
      if ((!bVar3) && (bVar3 = cmsys::SystemTools::FileIsSymlink(name), !bVar3)) {
        uVar9 = 1;
        if (bVar11 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_a00,"Re-run cmake, missing byproduct: ",0x21);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_a00,(name->_M_dataplus)._M_p,name->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Stdout((char *)local_ab8);
          if (local_ab8 != local_aa8) {
            operator_delete(local_ab8,local_aa8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a00);
          std::ios_base::~ios_base(local_990);
        }
        goto LAB_0038594b;
      }
    }
    local_a38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a00._0_8_ = local_a00 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a00,"CMAKE_MAKEFILE_DEPENDS","")
    ;
    pcVar4 = cmMakefile::GetDefinition(this_00,(string *)local_a00);
    if ((undefined1 *)local_a00._0_8_ != local_a00 + 0x10) {
      operator_delete((void *)local_a00._0_8_,local_9f0[0]._M_allocated_capacity + 1);
    }
    local_a00._0_8_ = local_a00 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a00,"CMAKE_MAKEFILE_OUTPUTS","")
    ;
    __s = cmMakefile::GetDefinition(this_00,(string *)local_a00);
    if ((undefined1 *)local_a00._0_8_ != local_a00 + 0x10) {
      operator_delete((void *)local_a00._0_8_,local_9f0[0]._M_allocated_capacity + 1);
    }
    if (__s != (char *)0x0 && pcVar4 != (char *)0x0) {
      local_a00._0_8_ = local_a00 + 0x10;
      sVar7 = strlen(pcVar4);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a00,pcVar4,pcVar4 + sVar7);
      cmSystemTools::ExpandListArgument((string *)local_a00,&local_a38,false);
      if ((undefined1 *)local_a00._0_8_ != local_a00 + 0x10) {
        operator_delete((void *)local_a00._0_8_,local_9f0[0]._M_allocated_capacity + 1);
      }
      local_a00._0_8_ = local_a00 + 0x10;
      sVar7 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a00,__s,__s + sVar7);
      cmSystemTools::ExpandListArgument((string *)local_a00,&local_a58,false);
      if ((undefined1 *)local_a00._0_8_ != local_a00 + 0x10) {
        operator_delete((void *)local_a00._0_8_,local_9f0[0]._M_allocated_capacity + 1);
      }
    }
    pbVar10 = local_a38.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((local_a38.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         local_a38.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (local_a58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_a58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      uVar9 = 1;
      if (bVar11 != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_a00,
                   "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n",0x43);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout((char *)local_ab8);
        if (local_ab8 != local_aa8) {
          operator_delete(local_ab8,local_aa8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a00);
        std::ios_base::~ios_base(local_990);
      }
    }
    else {
      local_ab8 = local_aa8;
      pcVar2 = ((local_a38.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_ab8,pcVar2,
                 pcVar2 + (local_a38.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      pbVar10 = pbVar10 + 1;
      if (pbVar10 !=
          local_a38.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          local_a78 = 0;
          bVar3 = cmFileTimeComparison::FileTimeCompare
                            (this->FileComparison,(char *)local_ab8,(pbVar10->_M_dataplus)._M_p,
                             &local_a78);
          if (!bVar3) {
            if (bVar11 != false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_a00,"Re-run cmake: build system dependency is missing\n",
                         0x31);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Stdout((char *)local_a98);
              if (local_a98 != local_a88) {
                operator_delete(local_a98,local_a88[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a00);
              std::ios_base::~ios_base(local_990);
            }
            uVar9 = 1;
            goto LAB_00385915;
          }
          if (local_a78 < 0) {
            std::__cxx11::string::_M_assign((string *)&local_ab8);
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 !=
                 local_a38.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      pbVar10 = local_a58.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = ((local_a58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_a98 = local_a88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a98,pcVar2,
                 pcVar2 + (local_a58.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      pbVar10 = pbVar10 + 1;
      if (pbVar10 !=
          local_a58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          local_abc = 0;
          bVar3 = cmFileTimeComparison::FileTimeCompare
                            (this->FileComparison,(char *)local_a98,(pbVar10->_M_dataplus)._M_p,
                             &local_abc);
          if (!bVar3) {
            if (bVar11 != false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_a00,"Re-run cmake: build system output is missing\n",0x2d)
              ;
              std::__cxx11::stringbuf::str();
              cmSystemTools::Stdout((char *)CONCAT44(uStack_a74,local_a78));
              if ((long *)CONCAT44(uStack_a74,local_a78) != local_a68) {
                operator_delete((long *)CONCAT44(uStack_a74,local_a78),local_a68[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a00);
              std::ios_base::~ios_base(local_990);
            }
            uVar9 = 1;
            goto LAB_003858fe;
          }
          if (0 < local_abc) {
            std::__cxx11::string::_M_assign((string *)&local_a98);
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 !=
                 local_a58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_abc = 0;
      bVar3 = cmFileTimeComparison::FileTimeCompare
                        (this->FileComparison,(char *)local_a98,(char *)local_ab8,&local_abc);
      bVar12 = local_abc < 0;
      if (bVar11 == true && (!bVar3 || bVar12)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_a00,"Re-run cmake file: ",0x13);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_a00,(char *)local_a98,local_a90);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," older than: ",0xd);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_ab8,local_ab0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout((char *)CONCAT44(uStack_a74,local_a78));
        if ((long *)CONCAT44(uStack_a74,local_a78) != local_a68) {
          operator_delete((long *)CONCAT44(uStack_a74,local_a78),local_a68[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a00);
        std::ios_base::~ios_base(local_990);
      }
      uVar9 = (uint)(!bVar3 || bVar12);
LAB_003858fe:
      if (local_a98 != local_a88) {
        operator_delete(local_a98,local_a88[0] + 1);
      }
LAB_00385915:
      if (local_ab8 != local_aa8) {
        operator_delete(local_ab8,local_aa8[0] + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a38);
LAB_0038594b:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a18);
    if (pcVar6 == (cmLocalGenerator *)0x0) goto LAB_00384f3c;
  }
  (*pcVar6->_vptr_cmLocalGenerator[1])(pcVar6);
LAB_00384f3c:
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)local_5f8);
  ~cmake(&local_858);
  return uVar9;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.  Use
  // the make system's VERBOSE environment variable to enable verbose
  // output. This can be skipped by setting CMAKE_NO_VERBOSE (which is set
  // by the Eclipse and KDevelop generators).
  bool verbose = ((cmSystemTools::GetEnv("VERBOSE") != 0)
                   && (cmSystemTools::GetEnv("CMAKE_NO_VERBOSE") == 0));

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if(this->CheckBuildSystemArgument.empty())
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake no build system arguments\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // If the file provided does not exist, we have to rerun.
  if(!cmSystemTools::FileExists(this->CheckBuildSystemArgument.c_str()))
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: "
          << this->CheckBuildSystemArgument << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cmGlobalGenerator gg(&cm);
  cmsys::auto_ptr<cmLocalGenerator> lg(gg.MakeLocalGenerator());
  cmMakefile* mf = lg->GetMakefile();
  if(!mf->ReadListFile(this->CheckBuildSystemArgument.c_str()) ||
     cmSystemTools::GetErrorOccuredFlag())
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : "
          << this->CheckBuildSystemArgument << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    // There was an error reading the file.  Just rerun.
    return 1;
    }

  if(this->ClearBuildSystem)
    {
    // Get the generator used for this build system.
    const char* genName = mf->GetDefinition("CMAKE_DEPENDS_GENERATOR");
    if(!genName || genName[0] == '\0')
      {
      genName = "Unix Makefiles";
      }

    // Create the generator and use it to clear the dependencies.
    cmsys::auto_ptr<cmGlobalGenerator>
      ggd(this->CreateGlobalGenerator(genName));
    if(ggd.get())
      {
      cmsys::auto_ptr<cmLocalGenerator> lgd(ggd->MakeLocalGenerator());
      lgd->ClearDependencies(mf, verbose);
      }
    }

  // If any byproduct of makefile generation is missing we must re-run.
  std::vector<std::string> products;
  if(const char* productStr = mf->GetDefinition("CMAKE_MAKEFILE_PRODUCTS"))
    {
    cmSystemTools::ExpandListArgument(productStr, products);
    }
  for(std::vector<std::string>::const_iterator pi = products.begin();
      pi != products.end(); ++pi)
    {
    if(!(cmSystemTools::FileExists(pi->c_str()) ||
         cmSystemTools::FileIsSymlink(*pi)))
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake, missing byproduct: " << *pi << "\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // Get the set of dependencies and outputs.
  std::vector<std::string> depends;
  std::vector<std::string> outputs;
  const char* dependsStr = mf->GetDefinition("CMAKE_MAKEFILE_DEPENDS");
  const char* outputsStr = mf->GetDefinition("CMAKE_MAKEFILE_OUTPUTS");
  if(dependsStr && outputsStr)
    {
    cmSystemTools::ExpandListArgument(dependsStr, depends);
    cmSystemTools::ExpandListArgument(outputsStr, outputs);
    }
  if(depends.empty() || outputs.empty())
    {
    // Not enough information was provided to do the test.  Just rerun.
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
        "or CMAKE_MAKEFILE_OUTPUTS :\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // Find the newest dependency.
  std::vector<std::string>::iterator dep = depends.begin();
  std::string dep_newest = *dep++;
  for(;dep != depends.end(); ++dep)
    {
    int result = 0;
    if(this->FileComparison->FileTimeCompare(dep_newest.c_str(),
                                             dep->c_str(), &result))
      {
      if(result < 0)
        {
        dep_newest = *dep;
        }
      }
    else
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake: build system dependency is missing\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // Find the oldest output.
  std::vector<std::string>::iterator out = outputs.begin();
  std::string out_oldest = *out++;
  for(;out != outputs.end(); ++out)
    {
    int result = 0;
    if(this->FileComparison->FileTimeCompare(out_oldest.c_str(),
                                             out->c_str(), &result))
      {
      if(result > 0)
        {
        out_oldest = *out;
        }
      }
    else
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake: build system output is missing\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // If any output is older than any dependency then rerun.
  {
  int result = 0;
  if(!this->FileComparison->FileTimeCompare(out_oldest.c_str(),
                                            dep_newest.c_str(),
                                            &result) ||
     result < 0)
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake file: " << out_oldest
          << " older than: " << dep_newest << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }
  }

  // No need to rerun.
  return 0;
}